

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O2

int ll_loadlib(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *sym;
  
  pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
  luaL_checklstring(L,2,(size_t *)0x0);
  iVar1 = ll_loadfunc(L,pcVar2,sym);
  lua_pushnil(L);
  lua_insert(L,-2);
  pcVar2 = "init";
  if (iVar1 == 1) {
    pcVar2 = "absent";
  }
  lua_pushstring(L,pcVar2);
  return 3;
}

Assistant:

static int ll_loadlib (lua_State *L) {
  const char *path = luaL_checkstring(L, 1);
  const char *init = luaL_checkstring(L, 2);
  int stat = ll_loadfunc(L, path, init);
  if (stat == 0)  /* no errors? */
    return 1;  /* return the loaded function */
  else {  /* error; error message is on stack top */
    lua_pushnil(L);
    lua_insert(L, -2);
    lua_pushstring(L, (stat == ERRLIB) ?  LIB_FAIL : "init");
    return 3;  /* return nil, error message, and where */
  }
}